

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RootObjectBase.cpp
# Opt level: O0

void __thiscall
Js::RootObjectInlineCache::RootObjectInlineCache
          (RootObjectInlineCache *this,InlineCacheAllocator *allocator)

{
  InlineCacheAllocator *pIVar1;
  InlineCache *this_00;
  TrackAllocData local_48;
  nullptr_t local_20;
  InlineCacheAllocator *local_18;
  InlineCacheAllocator *allocator_local;
  RootObjectInlineCache *this_local;
  
  this->refCount = 1;
  local_20 = (nullptr_t)0x0;
  local_18 = allocator;
  allocator_local = (InlineCacheAllocator *)this;
  Memory::WriteBarrierPtr<Js::InlineCache>::WriteBarrierPtr(&this->inlineCache,&local_20);
  pIVar1 = local_18;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&InlineCache::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RootObjectBase.cpp"
             ,0xd);
  pIVar1 = (InlineCacheAllocator *)
           Memory::ArenaAllocatorBase<Memory::InlineCacheFreeListPolicy,_5UL,_true,_1024UL>::
           TrackAllocInfo(&pIVar1->
                           super_ArenaAllocatorBase<Memory::InlineCacheFreeListPolicy,_5UL,_true,_1024UL>
                          ,&local_48);
  this_00 = (InlineCache *)new<Memory::InlineCacheAllocator>(0x20,pIVar1,0xa3a9c0);
  InlineCache::InlineCache(this_00);
  Memory::WriteBarrierPtr<Js::InlineCache>::operator=(&this->inlineCache,this_00);
  return;
}

Assistant:

RootObjectInlineCache::RootObjectInlineCache(InlineCacheAllocator * allocator):
        inlineCache(nullptr), refCount(1)
    {
        inlineCache = AllocatorNewZ(InlineCacheAllocator,
            allocator, Js::InlineCache);
    }